

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O0

void convolve_Gaussian(uchar (*inpic) [512] [512],float (*floatpic) [512] [512],
                      uchar (*pic) [512] [512],float sigma,int pic_t,int pic_x,int pic_y,int start,
                      int frame,int time)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  int local_1e8;
  int local_1e4;
  int b;
  int a;
  int offset;
  int j;
  int i;
  int size;
  float sum;
  float term;
  float mask [100];
  int pic_y_local;
  int pic_x_local;
  int pic_t_local;
  float sigma_local;
  uchar (*pic_local) [512] [512];
  float (*floatpic_local) [512] [512];
  uchar (*inpic_local) [512] [512];
  
  if (OUTPUT_SMOOTH != 0) {
    printf("\nStart of 3D convolution\n");
    printf("Time: %d Frame: %d\n",(ulong)(uint)time,(ulong)(uint)frame);
  }
  fflush(_stdout);
  j = (int)(sigma * 6.0 + 1.0);
  if (j % 2 == 0) {
    j = j + 1;
  }
  uVar1 = j / 2;
  if (j <= pic_t) {
    i = 0;
    if ((sigma != 0.0) || (NAN(sigma))) {
      for (offset = 0; offset < j; offset = offset + 1) {
        dVar2 = sqrt(6.283185307179586);
        dVar3 = exp((double)(int)(-(offset - uVar1) * (offset - uVar1)) /
                    ((double)sigma * 2.0 * (double)sigma));
        (&sum)[offset] = (float)((1.0 / (dVar2 * (double)sigma)) * dVar3);
        i = (int)((float)i + (&sum)[offset]);
      }
    }
    else {
      sum = 1.0;
      i = 0x3f800000;
    }
    if (OUTPUT_SMOOTH != 0) {
      printf("Size: %d Offset: %d\nMask values: ",(ulong)(uint)j,(ulong)uVar1);
      for (offset = 0; offset < j; offset = offset + 1) {
        printf("%f ",(double)(&sum)[offset]);
      }
      printf("\nSum of mask values: %f\n",(double)(float)i);
    }
    for (offset = 0; offset < pic_x; offset = offset + 1) {
      for (a = 0; a < pic_y; a = a + 1) {
        pic1[offset][a] = 0.0;
        pic0[offset][a] = 0.0;
      }
    }
    if ((sigma != 0.0) || (NAN(sigma))) {
      for (offset = 0; offset < pic_x; offset = offset + 1) {
        for (a = 0; a < pic_y; a = a + 1) {
          size = 0;
          for (local_1e4 = -uVar1; local_1e4 <= (int)uVar1; local_1e4 = local_1e4 + 1) {
            size = (int)((float)inpic[(local_1e4 + frame) - start][offset][a] *
                         (&sum)[(int)(local_1e4 + uVar1)] + (float)size);
          }
          pic0[offset][a] = (float)size;
        }
      }
      offset = uVar1;
      if (OUTPUT_SMOOTH != 0) {
        printf("Convolution in t direction completed\n");
      }
      for (; offset < (int)(pic_x - uVar1); offset = offset + 1) {
        for (a = 0; a < pic_y; a = a + 1) {
          size = 0;
          for (local_1e4 = -uVar1; local_1e4 <= (int)uVar1; local_1e4 = local_1e4 + 1) {
            size = (int)(pic0[offset + local_1e4][a] * (&sum)[(int)(local_1e4 + uVar1)] +
                        (float)size);
          }
          pic1[offset][a] = (float)size;
        }
      }
      offset = uVar1;
      if (OUTPUT_SMOOTH != 0) {
        printf("Convolution in x direction completed\n");
      }
      for (; a = uVar1, offset < (int)(pic_x - uVar1); offset = offset + 1) {
        for (; a < (int)(pic_y - uVar1); a = a + 1) {
          size = 0;
          for (local_1e8 = -uVar1; local_1e8 <= (int)uVar1; local_1e8 = local_1e8 + 1) {
            size = (int)(pic1[offset][a + local_1e8] * (&sum)[(int)(local_1e8 + uVar1)] +
                        (float)size);
          }
          if (255.0 < (float)size) {
            size = 0x437f0000;
          }
          if ((float)size < 0.0) {
            size = 0;
          }
          floatpic[time][offset][a] = (float)size;
          pic[time][offset][a] = (uchar)(int)((float)size + 0.5);
        }
      }
      if (OUTPUT_SMOOTH != 0) {
        printf("Convolution in y direction completed\n");
      }
    }
    else {
      for (offset = 0; offset < pic_x; offset = offset + 1) {
        for (a = 0; a < pic_y; a = a + 1) {
          pic[time][offset][a] = inpic[frame - start][offset][a];
        }
      }
    }
    if (OUTPUT_SMOOTH != 0) {
      printf("End of Convolution\n");
    }
    fflush(_stdout);
    return;
  }
  printf("\nFatal error: not enough images\n");
  exit(1);
}

Assistant:

void convolve_Gaussian(
unsigned char inpic[PIC_T][PIC_X][PIC_Y],
float floatpic[FIVE][PIC_X][PIC_Y],
unsigned char pic[FIVE][PIC_X][PIC_Y],
float sigma, int pic_t, int pic_x, int pic_y,
int start, int frame, int time)
{
float mask[100],term,sum;
int size,i,j,offset,a,b;


if(OUTPUT_SMOOTH)
{
printf("\nStart of 3D convolution\n");
printf("Time: %d Frame: %d\n",time,frame);
}

fflush(stdout);
size = (int) (6*sigma+1);
if(size%2==0) size = size+1;
offset = size/2;
if(pic_t < size)
	{
	printf("\nFatal error: not enough images\n");
	exit(1);
	}
sum = 0.0;

if(sigma != 0.0)
for(i=0;i<size;i++)
	{
	mask[i] = (1.0/(sqrt(2.0*M_PI)*sigma))*
		exp(-(i-offset)*(i-offset)/(2.0*sigma*sigma));
	sum = sum+mask[i];
	}
else { mask[0] = 1.0; sum = 1.0; }

if(OUTPUT_SMOOTH)
{
printf("Size: %d Offset: %d\nMask values: ",size,offset);
for(i=0;i<size;i++)
	printf("%f ",mask[i]);
printf("\nSum of mask values: %f\n",sum);
}
for(i=0;i<pic_x;i++)
for(j=0;j<pic_y;j++)
	pic0[i][j] = pic1[i][j] = 0.0;


if(sigma != 0.0)
{
for(i=0;i<pic_x;i++)
for(j=0;j<pic_y;j++)
	{
	term = 0.0;
	for(a=-offset;a<=offset;a++)
		{
		term = term +(inpic[a+frame-start][i][j]*mask[a+offset]);
		}
	pic0[i][j] = term;
	}
if(OUTPUT_SMOOTH) printf("Convolution in t direction completed\n");
for(i=offset;i<pic_x-offset;i++)
for(j=0;j<pic_y;j++)
	{
	term = 0.0;
	for(a=-offset;a<=offset;a++)
		{
		term = term + (pic0[i+a][j]*mask[a+offset]);
		}
	pic1[i][j] = term;
	}
if(OUTPUT_SMOOTH) printf("Convolution in x direction completed\n");

for(i=offset;i<pic_x-offset;i++)
for(j=offset;j<pic_y-offset;j++)
	{
	term = 0.0;
	for(b=-offset;b<=offset;b++)
		{
		term = term + (pic1[i][j+b])*mask[b+offset];
		}
	if(term > 255.0) term = 255.0;
	if(term < 0.0) term = 0.0;
	floatpic[time][i][j] = term;
	pic[time][i][j] = (int) (term+0.5);
	}
if(OUTPUT_SMOOTH) printf("Convolution in y direction completed\n");
}
else /* No smoothing */
for(i=0;i<pic_x;i++)
for(j=0;j<pic_y;j++)
	pic[time][i][j] = inpic[frame-start][i][j];

if(OUTPUT_SMOOTH) printf("End of Convolution\n");
fflush(stdout);
}